

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct4x4_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar21;
  uint uVar22;
  undefined1 auVar20 [16];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  __m128i offset;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  
  lVar5 = (long)bit * 0x100;
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x1a0);
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  iVar4 = -iVar7;
  iVar6 = bd + 6 + (uint)(do_cols == 0) * 2;
  auVar20 = ZEXT416((uint)bit);
  iVar2 = 0x8000;
  if (0xf < iVar6) {
    iVar2 = 1 << ((char)iVar6 - 1U & 0x1f);
  }
  iVar6 = -iVar2;
  iVar2 = iVar2 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1e0);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x220);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar40._4_4_ = iVar7;
  auVar40._0_4_ = iVar7;
  auVar40._8_4_ = iVar7;
  auVar40._12_4_ = iVar7;
  auVar39._4_4_ = iVar4;
  auVar39._0_4_ = iVar4;
  auVar39._8_4_ = iVar4;
  auVar39._12_4_ = iVar4;
  auVar8 = pmulld((undefined1  [16])*in,auVar42);
  auVar42 = pmulld(auVar42,(undefined1  [16])in[2]);
  iVar7 = auVar8._0_4_ + iVar3;
  iVar4 = auVar8._4_4_ + iVar3;
  iVar9 = auVar8._8_4_ + iVar3;
  iVar10 = auVar8._12_4_ + iVar3;
  iVar11 = iVar7 + auVar42._0_4_ >> auVar20;
  iVar13 = iVar4 + auVar42._4_4_ >> auVar20;
  iVar15 = iVar9 + auVar42._8_4_ >> auVar20;
  iVar17 = iVar10 + auVar42._12_4_ >> auVar20;
  iVar7 = iVar7 - auVar42._0_4_ >> auVar20;
  iVar4 = iVar4 - auVar42._4_4_ >> auVar20;
  iVar9 = iVar9 - auVar42._8_4_ >> auVar20;
  iVar10 = iVar10 - auVar42._12_4_ >> auVar20;
  auVar8 = pmulld(auVar40,(undefined1  [16])in[1]);
  auVar42 = pmulld((undefined1  [16])in[1],auVar41);
  auVar40 = pmulld(auVar39,(undefined1  [16])in[3]);
  iVar43 = auVar42._0_4_ + iVar3 + auVar40._0_4_ >> auVar20;
  iVar44 = auVar42._4_4_ + iVar3 + auVar40._4_4_ >> auVar20;
  iVar45 = auVar42._8_4_ + iVar3 + auVar40._8_4_ >> auVar20;
  iVar46 = auVar42._12_4_ + iVar3 + auVar40._12_4_ >> auVar20;
  auVar41 = pmulld((undefined1  [16])in[3],auVar41);
  iVar35 = auVar8._0_4_ + iVar3 + auVar41._0_4_ >> auVar20;
  iVar36 = auVar8._4_4_ + iVar3 + auVar41._4_4_ >> auVar20;
  iVar37 = auVar8._8_4_ + iVar3 + auVar41._8_4_ >> auVar20;
  iVar38 = auVar8._12_4_ + iVar3 + auVar41._12_4_ >> auVar20;
  iVar3 = iVar35 + iVar11;
  iVar26 = iVar36 + iVar13;
  iVar29 = iVar37 + iVar15;
  iVar32 = iVar38 + iVar17;
  iVar11 = iVar11 - iVar35;
  iVar13 = iVar13 - iVar36;
  iVar15 = iVar15 - iVar37;
  iVar17 = iVar17 - iVar38;
  uVar24 = (uint)(iVar3 < iVar6) * iVar6 | (uint)(iVar3 >= iVar6) * iVar3;
  uVar27 = (uint)(iVar26 < iVar6) * iVar6 | (uint)(iVar26 >= iVar6) * iVar26;
  uVar30 = (uint)(iVar29 < iVar6) * iVar6 | (uint)(iVar29 >= iVar6) * iVar29;
  uVar33 = (uint)(iVar32 < iVar6) * iVar6 | (uint)(iVar32 >= iVar6) * iVar32;
  uVar25 = (uint)(iVar2 < (int)uVar24) * iVar2 | (iVar2 >= (int)uVar24) * uVar24;
  uVar28 = (uint)(iVar2 < (int)uVar27) * iVar2 | (iVar2 >= (int)uVar27) * uVar27;
  uVar31 = (uint)(iVar2 < (int)uVar30) * iVar2 | (iVar2 >= (int)uVar30) * uVar30;
  uVar34 = (uint)(iVar2 < (int)uVar33) * iVar2 | (iVar2 >= (int)uVar33) * uVar33;
  uVar24 = (uint)(iVar11 < iVar6) * iVar6 | (uint)(iVar11 >= iVar6) * iVar11;
  uVar27 = (uint)(iVar13 < iVar6) * iVar6 | (uint)(iVar13 >= iVar6) * iVar13;
  uVar30 = (uint)(iVar15 < iVar6) * iVar6 | (uint)(iVar15 >= iVar6) * iVar15;
  uVar33 = (uint)(iVar17 < iVar6) * iVar6 | (uint)(iVar17 >= iVar6) * iVar17;
  uVar12 = (uint)(iVar2 < (int)uVar24) * iVar2 | (iVar2 >= (int)uVar24) * uVar24;
  uVar14 = (uint)(iVar2 < (int)uVar27) * iVar2 | (iVar2 >= (int)uVar27) * uVar27;
  uVar16 = (uint)(iVar2 < (int)uVar30) * iVar2 | (iVar2 >= (int)uVar30) * uVar30;
  uVar18 = (uint)(iVar2 < (int)uVar33) * iVar2 | (iVar2 >= (int)uVar33) * uVar33;
  *(uint *)*out = uVar25;
  *(uint *)((long)*out + 4) = uVar28;
  *(uint *)(*out + 1) = uVar31;
  *(uint *)((long)*out + 0xc) = uVar34;
  *(uint *)out[3] = uVar12;
  *(uint *)((long)out[3] + 4) = uVar14;
  *(uint *)(out[3] + 1) = uVar16;
  *(uint *)((long)out[3] + 0xc) = uVar18;
  iVar3 = iVar43 + iVar7;
  iVar11 = iVar44 + iVar4;
  iVar13 = iVar45 + iVar9;
  iVar15 = iVar46 + iVar10;
  iVar7 = iVar7 - iVar43;
  iVar4 = iVar4 - iVar44;
  iVar9 = iVar9 - iVar45;
  iVar10 = iVar10 - iVar46;
  uVar24 = (uint)(iVar3 < iVar6) * iVar6 | (uint)(iVar3 >= iVar6) * iVar3;
  uVar27 = (uint)(iVar11 < iVar6) * iVar6 | (uint)(iVar11 >= iVar6) * iVar11;
  uVar30 = (uint)(iVar13 < iVar6) * iVar6 | (uint)(iVar13 >= iVar6) * iVar13;
  uVar33 = (uint)(iVar15 < iVar6) * iVar6 | (uint)(iVar15 >= iVar6) * iVar15;
  uVar19 = (uint)(iVar2 < (int)uVar24) * iVar2 | (iVar2 >= (int)uVar24) * uVar24;
  uVar21 = (uint)(iVar2 < (int)uVar27) * iVar2 | (iVar2 >= (int)uVar27) * uVar27;
  uVar22 = (uint)(iVar2 < (int)uVar30) * iVar2 | (iVar2 >= (int)uVar30) * uVar30;
  uVar23 = (uint)(iVar2 < (int)uVar33) * iVar2 | (iVar2 >= (int)uVar33) * uVar33;
  uVar24 = (uint)(iVar7 < iVar6) * iVar6 | (uint)(iVar7 >= iVar6) * iVar7;
  uVar27 = (uint)(iVar4 < iVar6) * iVar6 | (uint)(iVar4 >= iVar6) * iVar4;
  uVar30 = (uint)(iVar9 < iVar6) * iVar6 | (uint)(iVar9 >= iVar6) * iVar9;
  uVar33 = (uint)(iVar10 < iVar6) * iVar6 | (uint)(iVar10 >= iVar6) * iVar10;
  uVar24 = (uint)(iVar2 < (int)uVar24) * iVar2 | (iVar2 >= (int)uVar24) * uVar24;
  uVar27 = (uint)(iVar2 < (int)uVar27) * iVar2 | (iVar2 >= (int)uVar27) * uVar27;
  uVar30 = (uint)(iVar2 < (int)uVar30) * iVar2 | (iVar2 >= (int)uVar30) * uVar30;
  uVar33 = (uint)(iVar2 < (int)uVar33) * iVar2 | (iVar2 >= (int)uVar33) * uVar33;
  *(uint *)out[1] = uVar19;
  *(uint *)((long)out[1] + 4) = uVar21;
  *(uint *)(out[1] + 1) = uVar22;
  *(uint *)((long)out[1] + 0xc) = uVar23;
  *(uint *)out[2] = uVar24;
  *(uint *)((long)out[2] + 4) = uVar27;
  *(uint *)(out[2] + 1) = uVar30;
  *(uint *)((long)out[2] + 0xc) = uVar33;
  if (do_cols == 0) {
    iVar7 = 10;
    if (10 < bd) {
      iVar7 = bd;
    }
    iVar7 = 0x20 << ((byte)iVar7 & 0x1f);
    iVar2 = -iVar7;
    iVar7 = iVar7 + -1;
    iVar17 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar20 = ZEXT416((uint)out_shift);
    iVar10 = (int)(uVar25 + iVar17) >> auVar20;
    iVar11 = (int)(uVar28 + iVar17) >> auVar20;
    iVar13 = (int)(uVar31 + iVar17) >> auVar20;
    iVar15 = (int)(uVar34 + iVar17) >> auVar20;
    iVar3 = (int)(uVar12 + iVar17) >> auVar20;
    iVar4 = (int)(uVar14 + iVar17) >> auVar20;
    iVar6 = (int)(uVar16 + iVar17) >> auVar20;
    iVar9 = (int)(uVar18 + iVar17) >> auVar20;
    uVar25 = (uint)(iVar10 < iVar2) * iVar2 | (uint)(iVar10 >= iVar2) * iVar10;
    uVar28 = (uint)(iVar11 < iVar2) * iVar2 | (uint)(iVar11 >= iVar2) * iVar11;
    uVar31 = (uint)(iVar13 < iVar2) * iVar2 | (uint)(iVar13 >= iVar2) * iVar13;
    uVar34 = (uint)(iVar15 < iVar2) * iVar2 | (uint)(iVar15 >= iVar2) * iVar15;
    uVar12 = (uint)(iVar3 < iVar2) * iVar2 | (uint)(iVar3 >= iVar2) * iVar3;
    uVar14 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
    uVar16 = (uint)(iVar6 < iVar2) * iVar2 | (uint)(iVar6 >= iVar2) * iVar6;
    uVar18 = (uint)(iVar9 < iVar2) * iVar2 | (uint)(iVar9 >= iVar2) * iVar9;
    *(uint *)*out = (uint)(iVar7 < (int)uVar25) * iVar7 | (iVar7 >= (int)uVar25) * uVar25;
    *(uint *)((long)*out + 4) =
         (uint)(iVar7 < (int)uVar28) * iVar7 | (iVar7 >= (int)uVar28) * uVar28;
    *(uint *)(*out + 1) = (uint)(iVar7 < (int)uVar31) * iVar7 | (iVar7 >= (int)uVar31) * uVar31;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar7 < (int)uVar34) * iVar7 | (iVar7 >= (int)uVar34) * uVar34;
    *(uint *)out[3] = (uint)(iVar7 < (int)uVar12) * iVar7 | (iVar7 >= (int)uVar12) * uVar12;
    *(uint *)((long)out[3] + 4) =
         (uint)(iVar7 < (int)uVar14) * iVar7 | (iVar7 >= (int)uVar14) * uVar14;
    *(uint *)(out[3] + 1) = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    *(uint *)((long)out[3] + 0xc) =
         (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    iVar10 = (int)(uVar19 + iVar17) >> auVar20;
    iVar11 = (int)(uVar21 + iVar17) >> auVar20;
    iVar13 = (int)(uVar22 + iVar17) >> auVar20;
    iVar15 = (int)(uVar23 + iVar17) >> auVar20;
    iVar3 = (int)(uVar24 + iVar17) >> auVar20;
    iVar4 = (int)(uVar27 + iVar17) >> auVar20;
    iVar6 = (int)(uVar30 + iVar17) >> auVar20;
    iVar9 = (int)(uVar33 + iVar17) >> auVar20;
    uVar12 = (uint)(iVar10 < iVar2) * iVar2 | (uint)(iVar10 >= iVar2) * iVar10;
    uVar14 = (uint)(iVar11 < iVar2) * iVar2 | (uint)(iVar11 >= iVar2) * iVar11;
    uVar16 = (uint)(iVar13 < iVar2) * iVar2 | (uint)(iVar13 >= iVar2) * iVar13;
    uVar18 = (uint)(iVar15 < iVar2) * iVar2 | (uint)(iVar15 >= iVar2) * iVar15;
    uVar24 = (uint)(iVar3 < iVar2) * iVar2 | (uint)(iVar3 >= iVar2) * iVar3;
    uVar27 = (uint)(iVar4 < iVar2) * iVar2 | (uint)(iVar4 >= iVar2) * iVar4;
    uVar30 = (uint)(iVar6 < iVar2) * iVar2 | (uint)(iVar6 >= iVar2) * iVar6;
    uVar33 = (uint)(iVar9 < iVar2) * iVar2 | (uint)(iVar9 >= iVar2) * iVar9;
    *(uint *)out[1] = (uint)(iVar7 < (int)uVar12) * iVar7 | (iVar7 >= (int)uVar12) * uVar12;
    *(uint *)((long)out[1] + 4) =
         (uint)(iVar7 < (int)uVar14) * iVar7 | (iVar7 >= (int)uVar14) * uVar14;
    *(uint *)(out[1] + 1) = (uint)(iVar7 < (int)uVar16) * iVar7 | (iVar7 >= (int)uVar16) * uVar16;
    *(uint *)((long)out[1] + 0xc) =
         (uint)(iVar7 < (int)uVar18) * iVar7 | (iVar7 >= (int)uVar18) * uVar18;
    *(uint *)out[2] = (uint)(iVar7 < (int)uVar24) * iVar7 | (iVar7 >= (int)uVar24) * uVar24;
    *(uint *)((long)out[2] + 4) =
         (uint)(iVar7 < (int)uVar27) * iVar7 | (iVar7 >= (int)uVar27) * uVar27;
    *(uint *)(out[2] + 1) = (uint)(iVar7 < (int)uVar30) * iVar7 | (iVar7 >= (int)uVar30) * uVar30;
    *(uint *)((long)out[2] + 0xc) =
         (uint)(iVar7 < (int)uVar33) * iVar7 | (iVar7 >= (int)uVar33) * uVar33;
  }
  return;
}

Assistant:

static void idct4x4_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                           int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3, x, y;

  // Stage 0
  // Stage 1
  // Stage 2
  u0 = in[0];
  u1 = in[1];
  u2 = in[2];
  u3 = in[3];

  x = _mm_mullo_epi32(u0, cospi32);
  y = _mm_mullo_epi32(u2, cospi32);
  v0 = _mm_add_epi32(x, y);
  v0 = _mm_add_epi32(v0, rnding);
  v0 = _mm_srai_epi32(v0, bit);

  v1 = _mm_sub_epi32(x, y);
  v1 = _mm_add_epi32(v1, rnding);
  v1 = _mm_srai_epi32(v1, bit);

  x = _mm_mullo_epi32(u1, cospi48);
  y = _mm_mullo_epi32(u3, cospim16);
  v2 = _mm_add_epi32(x, y);
  v2 = _mm_add_epi32(v2, rnding);
  v2 = _mm_srai_epi32(v2, bit);

  x = _mm_mullo_epi32(u1, cospi16);
  y = _mm_mullo_epi32(u3, cospi48);
  v3 = _mm_add_epi32(x, y);
  v3 = _mm_add_epi32(v3, rnding);
  v3 = _mm_srai_epi32(v3, bit);

  // Stage 3
  addsub_sse4_1(v0, v3, out + 0, out + 3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(v1, v2, out + 1, out + 2, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    log_range = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

    shift_and_clamp_sse4_1(out + 0, out + 3, &clamp_lo, &clamp_hi, out_shift);
    shift_and_clamp_sse4_1(out + 1, out + 2, &clamp_lo, &clamp_hi, out_shift);
  }
}